

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

char ** hts_readlines(char *fn,int *_n)

{
  int iVar1;
  BGZF *fp;
  kstream_t *ks;
  uchar *puVar2;
  char *pcVar3;
  void *__ptr;
  char *__dest;
  int iVar4;
  uint uVar5;
  char *__src;
  int iVar6;
  char **ppcVar7;
  char *pcVar8;
  int dret;
  void *local_70;
  char **local_68;
  int local_4c;
  kstring_t local_48;
  
  fp = bgzf_open(fn,"r");
  if (fp == (BGZF *)0x0) {
    ppcVar7 = (char **)0x0;
    if (*fn == ':') {
      pcVar3 = fn + 1;
      pcVar8 = fn + 2;
      __ptr = (void *)0x0;
      iVar1 = 0;
      __src = pcVar3;
      do {
        if ((pcVar8[-1] == ',') || (pcVar8[-1] == '\0')) {
          iVar6 = (int)ppcVar7;
          if (iVar1 == iVar6) {
            iVar4 = iVar1 * 2;
            if (iVar1 == 0) {
              iVar4 = 0x10;
            }
            __ptr = realloc(__ptr,(long)iVar4 << 3);
            iVar1 = iVar4;
          }
          __dest = (char *)calloc(((long)pcVar3 - (long)__src) + 1,1);
          *(char **)((long)__ptr + (long)iVar6 * 8) = __dest;
          ppcVar7 = (char **)(ulong)(iVar6 + 1);
          strncpy(__dest,__src,(long)pcVar3 - (long)__src);
          __src = pcVar8;
          if (pcVar8[-1] == '\0') goto LAB_0010d064;
        }
        pcVar8 = pcVar8 + 1;
        pcVar3 = pcVar3 + 1;
      } while( true );
    }
  }
  else {
    ks = (kstream_t *)calloc(1,0x28);
    local_48.l = 0;
    local_48.m = 0;
    local_48.s = (char *)0x0;
    ks->f = fp;
    *(uint *)&ks->field_0x8 = *(uint *)&ks->field_0x8 & 3 | 0x40000;
    puVar2 = (uchar *)malloc(0x10000);
    ks->buf = puVar2;
    ppcVar7 = (char **)0x0;
    local_70 = (void *)0x0;
    local_68 = (char **)0x0;
    while (iVar1 = ks_getuntil2(ks,2,&local_48,&local_4c,0), -1 < iVar1) {
      if (local_48.l != 0) {
        if (ppcVar7 == local_68) {
          uVar5 = (int)local_68 * 2;
          if ((int)local_68 == 0) {
            uVar5 = 0x10;
          }
          local_70 = realloc(local_70,(long)(int)uVar5 << 3);
          local_68 = (char **)(ulong)uVar5;
        }
        pcVar3 = strdup(local_48.s);
        *(char **)((long)local_70 + (long)ppcVar7 * 8) = pcVar3;
        ppcVar7 = (char **)((long)ppcVar7 + 1);
      }
    }
    ks_destroy(ks);
    bgzf_close(fp);
    __ptr = realloc(local_70,((ulong)ppcVar7 & 0xffffffff) << 3);
    free(local_48.s);
LAB_0010d064:
    iVar1 = (int)ppcVar7;
    ppcVar7 = (char **)realloc(__ptr,(long)iVar1 * 8);
    *_n = iVar1;
  }
  return ppcVar7;
}

Assistant:

char **hts_readlines(const char *fn, int *_n)
{
    int m = 0, n = 0, dret;
    char **s = 0;
#if KS_BGZF
    BGZF *fp = bgzf_open(fn, "r");
#else
    gzFile fp = gzopen(fn, "r");
#endif
    if ( fp ) { // read from file
        kstream_t *ks;
        kstring_t str;
        str.s = 0; str.l = str.m = 0;
        ks = ks_init(fp);
        while (ks_getuntil(ks, KS_SEP_LINE, &str, &dret) >= 0) {
            if (str.l == 0) continue;
            if (m == n) {
                m = m? m<<1 : 16;
                s = (char**)realloc(s, m * sizeof(char*));
            }
            s[n++] = strdup(str.s);
        }
        ks_destroy(ks);
        #if KS_BGZF
            bgzf_close(fp);
        #else
            gzclose(fp);
        #endif
        s = (char**)realloc(s, n * sizeof(char*));
        free(str.s);
    } else if (*fn == ':') { // read from string
        const char *q, *p;
        for (q = p = fn + 1;; ++p)
            if (*p == ',' || *p == 0) {
                if (m == n) {
                    m = m? m<<1 : 16;
                    s = (char**)realloc(s, m * sizeof(char*));
                }
                s[n] = (char*)calloc(p - q + 1, 1);
                strncpy(s[n++], q, p - q);
                q = p + 1;
                if (*p == 0) break;
            }
    } else return 0;
    s = (char**)realloc(s, n * sizeof(char*));
    *_n = n;
    return s;
}